

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O1

void __thiscall libtorrent::socks5::on_connected(socks5 *this,error_code *e)

{
  service_type *psVar1;
  char *pcVar2;
  transfer_all_t local_61;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_58;
  _Bind<void_(libtorrent::socks5::*(std::shared_ptr<libtorrent::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_50;
  socket *local_30;
  mutable_buffers_1 local_28;
  
  if ((this->m_timer).impl_.implementation_.might_have_pending_waits == true) {
    psVar1 = (this->m_timer).impl_.service_;
    boost::asio::detail::epoll_reactor::
    cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
              (psVar1->scheduler_,&psVar1->timer_queue_,
               &(this->m_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
    (this->m_timer).impl_.implementation_.might_have_pending_waits = false;
  }
  if (((e->val_ != 0x7d) || (e->cat_->id_ != 0x8fafd21e25c5e09b)) && (this->m_abort == false)) {
    if (e->failed_ == true) {
      if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0) {
        local_50._M_f = CONCAT71(local_50._M_f._1_7_,0x10);
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,(operation_t *)&local_50,e);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else {
      local_28.super_mutable_buffer.data_ = &this->m_tmp_buf;
      (this->m_tmp_buf)._M_elems[0] = '\x05';
      if (((this->m_proxy_settings).username._M_string_length == 0) ||
         ((this->m_proxy_settings).type == socks5)) {
        pcVar2 = (this->m_tmp_buf)._M_elems + 3;
        (this->m_tmp_buf)._M_elems[1] = '\x01';
        (this->m_tmp_buf)._M_elems[2] = '\0';
      }
      else {
        (this->m_tmp_buf)._M_elems[1] = '\x02';
        (this->m_tmp_buf)._M_elems[2] = '\0';
        (this->m_tmp_buf)._M_elems[3] = '\x02';
        pcVar2 = (this->m_tmp_buf)._M_elems + 4;
      }
      local_28.super_mutable_buffer.size_ = (long)pcVar2 - (long)local_28.super_mutable_buffer.data_
      ;
      std::__shared_ptr<libtorrent::socks5,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::socks5,void>
                ((__shared_ptr<libtorrent::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_60,
                 (__weak_ptr<libtorrent::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_50._M_f = (offset_in_socks5_to_subr)handshake1;
      local_50._8_8_ = 0;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::socks5>,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_std::shared_ptr<libtorrent::socks5>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::socks5>,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_std::shared_ptr<libtorrent::socks5>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Stack_58;
      local_60 = (element_type *)0x0;
      p_Stack_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_30 = &this->m_socks5_sock;
      boost::asio::detail::
      initiate_async_write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
      ::operator()((initiate_async_write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                    *)&local_30,&local_50,&local_28,&local_61);
      if (local_50._M_bound_args.
          super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::socks5>,_std::_Placeholder<1>_>.
          super__Head_base<0UL,_std::shared_ptr<libtorrent::socks5>,_false>._M_head_impl.
          super___shared_ptr<libtorrent::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50._M_bound_args.
                   super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::socks5>,_std::_Placeholder<1>_>
                   .super__Head_base<0UL,_std::shared_ptr<libtorrent::socks5>,_false>._M_head_impl.
                   super___shared_ptr<libtorrent::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (p_Stack_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_58);
      }
    }
  }
  return;
}

Assistant:

void socks5::on_connected(error_code const& e)
{
	COMPLETE_ASYNC("socks5::on_connected");

	m_timer.cancel();

	if (e == boost::asio::error::operation_aborted) return;

	if (m_abort) return;

	// we failed to connect to the proxy
	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::connect, e);
		++m_failures;
		retry_connection();
		return;
	}

	using namespace libtorrent::detail;

	// send SOCKS5 authentication methods
	char* p = m_tmp_buf.data();
	write_uint8(5, p); // SOCKS VERSION 5
	if (m_proxy_settings.username.empty()
		|| m_proxy_settings.type == settings_pack::socks5)
	{
		write_uint8(1, p); // 1 authentication method (no auth)
		write_uint8(0, p); // no authentication
	}
	else
	{
		write_uint8(2, p); // 2 authentication methods
		write_uint8(0, p); // no authentication
		write_uint8(2, p); // username/password
	}
	TORRENT_ASSERT_VAL(p - m_tmp_buf.data() < int(m_tmp_buf.size()), (p - m_tmp_buf.data()));
	ADD_OUTSTANDING_ASYNC("socks5::on_handshake1");
	boost::asio::async_write(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data()
		, aux::numeric_cast<std::size_t>(p - m_tmp_buf.data()))
		, std::bind(&socks5::handshake1, self(), _1));
}